

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal.h
# Opt level: O0

void chacha20_poly1305_open
               (uint8_t *out_plaintext,uint8_t *ciphertext,size_t plaintext_len,uint8_t *ad,
               size_t ad_len,chacha20_poly1305_open_data *data)

{
  int iVar1;
  chacha20_poly1305_open_data *data_local;
  size_t ad_len_local;
  uint8_t *ad_local;
  size_t plaintext_len_local;
  uint8_t *ciphertext_local;
  uint8_t *out_plaintext_local;
  
  iVar1 = CRYPTO_is_AVX2_capable();
  if ((iVar1 != 0) && (iVar1 = CRYPTO_is_BMI2_capable(), iVar1 != 0)) {
    chacha20_poly1305_open_avx2(out_plaintext,ciphertext,plaintext_len,ad,ad_len,data);
    return;
  }
  chacha20_poly1305_open_sse41(out_plaintext,ciphertext,plaintext_len,ad,ad_len,data);
  return;
}

Assistant:

inline void chacha20_poly1305_open(uint8_t *out_plaintext,
                                   const uint8_t *ciphertext,
                                   size_t plaintext_len, const uint8_t *ad,
                                   size_t ad_len,
                                   union chacha20_poly1305_open_data *data) {
  if (CRYPTO_is_AVX2_capable() && CRYPTO_is_BMI2_capable()) {
    chacha20_poly1305_open_avx2(out_plaintext, ciphertext, plaintext_len, ad,
                                ad_len, data);
  } else {
    chacha20_poly1305_open_sse41(out_plaintext, ciphertext, plaintext_len, ad,
                                 ad_len, data);
  }
}